

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O1

void __thiscall
EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT(EnvironmentNAVXYTHETAMLEVLAT *this)

{
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *pvVar1;
  pointer psVar2;
  void *pvVar3;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *pvVar4;
  pointer psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer *ppsVar9;
  pointer *ppsVar10;
  
  (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation =
       (_func_int **)&PTR_InitializeEnv_00157af0;
  pvVar1 = this->AddLevelFootprintPolygonV;
  if (pvVar1 != (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0) {
    psVar2 = pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppsVar9 = &pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if (psVar2 != (pointer)0x0) {
      lVar7 = (long)psVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar7);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)ppsVar9 + lVar7) - (long)pvVar3);
        }
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    operator_delete__(ppsVar9,(long)psVar2 * 0x18 + 8);
    this->AddLevelFootprintPolygonV = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0;
  }
  if (this->AdditionalInfoinActionsV != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) {
    if (0 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
            EnvNAVXYTHETALATCfg.NumThetaDirs) {
      lVar7 = 0;
      do {
        if (0 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.actionwidth) {
          lVar8 = 0;
          do {
            pvVar4 = this->AdditionalInfoinActionsV[lVar7][lVar8].intersectingcellsV;
            if (pvVar4 != (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x0) {
              psVar5 = pvVar4[-1].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppsVar10 = &pvVar4[-1].
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              if (psVar5 != (pointer)0x0) {
                lVar6 = (long)psVar5 * 0x18;
                do {
                  pvVar3 = *(void **)((long)&pvVar4[-1].
                                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar6);
                  if (pvVar3 != (void *)0x0) {
                    operator_delete(pvVar3,*(long *)((long)ppsVar10 + lVar6) - (long)pvVar3);
                  }
                  lVar6 = lVar6 + -0x18;
                } while (lVar6 != 0);
              }
              operator_delete__(ppsVar10,(long)psVar5 * 0x18 + 8);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE
                           .EnvNAVXYTHETALATCfg.actionwidth);
        }
        if (this->AdditionalInfoinActionsV[lVar7] != (EnvNAVXYTHETAMLEVLATAddInfoAction_t *)0x0) {
          operator_delete__(this->AdditionalInfoinActionsV[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                       EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    if (this->AdditionalInfoinActionsV != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) {
      operator_delete__(this->AdditionalInfoinActionsV);
    }
    this->AdditionalInfoinActionsV = (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0;
  }
  if (this->AddLevelGrid2D != (uchar ***)0x0) {
    if (0 < this->numofadditionalzlevs) {
      lVar7 = 0;
      do {
        if (0 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.EnvWidth_c) {
          lVar8 = 0;
          do {
            if (this->AddLevelGrid2D[lVar7][lVar8] != (uchar *)0x0) {
              operator_delete__(this->AddLevelGrid2D[lVar7][lVar8]);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE
                           .EnvNAVXYTHETALATCfg.EnvWidth_c);
        }
        if (this->AddLevelGrid2D[lVar7] != (uchar **)0x0) {
          operator_delete__(this->AddLevelGrid2D[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->numofadditionalzlevs);
    }
    if (this->AddLevelGrid2D != (uchar ***)0x0) {
      operator_delete__(this->AddLevelGrid2D);
    }
    this->AddLevelGrid2D = (uchar ***)0x0;
  }
  if (this->AddLevel_cost_possibly_circumscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_possibly_circumscribed_thresh);
    this->AddLevel_cost_possibly_circumscribed_thresh = (uchar *)0x0;
  }
  if (this->AddLevel_cost_inscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_inscribed_thresh);
    this->AddLevel_cost_inscribed_thresh = (uchar *)0x0;
  }
  this->numofadditionalzlevs = 0;
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&this->super_EnvironmentNAVXYTHETALAT);
  return;
}

Assistant:

EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT()
{
    if (AddLevelFootprintPolygonV != NULL) {
        delete[] AddLevelFootprintPolygonV;
        AddLevelFootprintPolygonV = NULL;
    }

    if (AdditionalInfoinActionsV != NULL) {
        for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
            for (int aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
                delete[] AdditionalInfoinActionsV[tind][aind].intersectingcellsV;
            }
            delete[] AdditionalInfoinActionsV[tind];
        }
        delete[] AdditionalInfoinActionsV;
        AdditionalInfoinActionsV = NULL;
    }

    if (AddLevelGrid2D != NULL) {
        for (int levelind = 0; levelind < numofadditionalzlevs; levelind++) {
            for (int xind = 0; xind < EnvNAVXYTHETALATCfg.EnvWidth_c; xind++) {
                delete[] AddLevelGrid2D[levelind][xind];
            }
            delete[] AddLevelGrid2D[levelind];
        }
        delete[] AddLevelGrid2D;
        AddLevelGrid2D = NULL;
    }

    if (AddLevel_cost_possibly_circumscribed_thresh != NULL) {
        delete[] AddLevel_cost_possibly_circumscribed_thresh;
        AddLevel_cost_possibly_circumscribed_thresh = NULL;
    }

    if (AddLevel_cost_inscribed_thresh != NULL) {
        delete[] AddLevel_cost_inscribed_thresh;
        AddLevel_cost_inscribed_thresh = NULL;
    }

    //reset the number of additional levels
    numofadditionalzlevs = 0;
}